

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O2

Type __thiscall QtPromise::resolve<QList<int>>(QtPromise *this,QList<int> *value)

{
  QSharedData *pQVar1;
  PromiseData<QList<int>_> *this_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> extraout_RDX;
  Type TVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_60;
  PromiseResolver<QList<int>_> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_50;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_48;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_40;
  QPromiseBase<QList<int>_> local_38;
  
  *(undefined ***)this = &PTR__QPromiseBase_0014d350;
  this_00 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0
  ;
  *(undefined8 *)&(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled
       = 0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<int>_>::PromiseData(this_00);
  *(PromiseData<QList<int>_> **)(this + 8) = this_00;
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_38.m_d.d = *(PromiseData<QList<int>_> **)(this + 8);
  if (local_38.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_38.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014d410;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver,(QPromise<QList<int>_> *)&local_38);
  QPromiseBase<QList<int>_>::~QPromiseBase(&local_38);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
         (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_48.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_40.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_40 = resolver.m_d.d;
  }
  local_50.d = (Data *)0x0;
  local_60 = resolver.m_d.d;
  QtPromisePrivate::PromiseResolver<QList<int>>::resolve<QList<int>>
            ((PromiseResolver<QList<int>> *)&local_60,value);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_40);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_50);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_60);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_48);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  *(undefined ***)this = &PTR__QPromiseBase_0014d410;
  TVar2.super_QPromiseBase<QList<int>_>.m_d.d = extraout_RDX.d;
  TVar2.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar2.super_QPromiseBase<QList<int>_>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}